

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall google::protobuf::MessageOptions::IsInitialized(MessageOptions *this)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  bVar3 = 0 < iVar1;
  if (0 < iVar1) {
    cVar2 = (**(code **)(**(this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_ + 0x28
                        ))();
    if (cVar2 != '\0') {
      lVar5 = 1;
      do {
        lVar4 = (long)(this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
        bVar3 = lVar5 < lVar4;
        if (lVar4 <= lVar5) goto LAB_0019a058;
        cVar2 = (**(code **)(*(this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_
                              [lVar5] + 0x28))();
        lVar5 = lVar5 + 1;
      } while (cVar2 != '\0');
    }
    if (bVar3) {
      return false;
    }
  }
LAB_0019a058:
  bVar3 = internal::ExtensionSet::IsInitialized(&this->_extensions_);
  return bVar3;
}

Assistant:

bool MessageOptions::IsInitialized() const {

  for (int i = 0; i < uninterpreted_option_size(); i++) {
    if (!this->uninterpreted_option(i).IsInitialized()) return false;
  }

  if (!_extensions_.IsInitialized()) return false;  return true;
}